

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Random.cpp
# Opt level: O1

void amrex::RestoreRandomState(istream *is,int nthreads_old,int nstep_old)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *pmVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  unsigned_long uVar9;
  long lVar10;
  int iVar11;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *pmVar12;
  ulong uVar13;
  size_t __i;
  long lVar14;
  
  uVar5 = (uint)::(anonymous_namespace)::nthreads;
  if (nthreads_old <= (int)(uint)::(anonymous_namespace)::nthreads) {
    uVar5 = nthreads_old;
  }
  if (0 < (int)uVar5) {
    std::
    operator>><unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL,_char,_std::char_traits<char>_>
              (is,::(anonymous_namespace)::generators);
  }
  pmVar4 = ::(anonymous_namespace)::generators;
  uVar7 = (ulong)(uint)::(anonymous_namespace)::nthreads;
  if (nthreads_old < (int)(uint)::(anonymous_namespace)::nthreads) {
    iVar1 = *(int *)(ParallelContext::frames + 0xc);
    iVar2 = *(int *)(ParallelContext::frames + 0x10);
    lVar10 = 0;
    iVar11 = 0;
    if (uVar7 != 0) {
      iVar11 = iVar2;
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)(nstep_old + 1);
    iVar6 = 0;
    if ((ulong)(long)iVar2 < SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar3,0))
    {
      iVar6 = iVar11 * nstep_old;
    }
    if (uVar7 == 0) {
      iVar6 = iVar11 * nstep_old;
    }
    uVar8 = (ulong)nthreads_old;
    pmVar12 = ::(anonymous_namespace)::generators + uVar8;
    uVar13 = uVar8;
    do {
      pmVar4[uVar13]._M_x[0] = (ulong)(uint)(iVar2 * (int)uVar13 + iVar1 + 1 + iVar6);
      uVar9 = pmVar4[lVar10 + uVar8]._M_x[0];
      lVar14 = 1;
      do {
        uVar9 = (unsigned_long)(((uint)(uVar9 >> 0x1e) ^ (uint)uVar9) * 0x6c078965 + (int)lVar14);
        pmVar12->_M_x[lVar14] = uVar9;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 0x270);
      pmVar4[uVar13]._M_p = 0x270;
      uVar13 = uVar13 + 1;
      lVar10 = lVar10 + 1;
      pmVar12 = pmVar12 + 1;
    } while (uVar13 != uVar7);
  }
  return;
}

Assistant:

void
amrex::RestoreRandomState (std::istream& is, int nthreads_old, int nstep_old)
{
    int N = std::min(nthreads, nthreads_old);
    for (int i = 0; i < N; i++)
        is >> generators[i];
    if (nthreads > nthreads_old) {
        const int NProcs = ParallelDescriptor::NProcs();
        const int MyProc = ParallelDescriptor::MyProc();
        for (int i = nthreads_old; i < nthreads; i++) {
            amrex::ULong seed = MyProc+1 + i*NProcs;
            if (std::numeric_limits<amrex::ULong>::max()/(amrex::ULong)(nstep_old+1)
                > static_cast<amrex::ULong>(nthreads*NProcs)) // avoid overflow
            {
                seed += nstep_old*nthreads*NProcs;
            }

            generators[i].seed(seed);
        }
    }
}